

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool cmQtAutoGenerator::FileDiffers(string *filename,string *content)

{
  bool bVar1;
  __type _Var2;
  bool bVar3;
  string oldContents;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  bVar1 = FileRead(&local_30,filename,(string *)0x0);
  bVar3 = true;
  if (bVar1) {
    _Var2 = std::operator==(&local_30,content);
    bVar3 = !_Var2;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar3;
}

Assistant:

bool cmQtAutoGenerator::FileDiffers(std::string const& filename,
                                    std::string const& content)
{
  bool differs = true;
  std::string oldContents;
  if (FileRead(oldContents, filename) && (oldContents == content)) {
    differs = false;
  }
  return differs;
}